

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O2

void __thiscall pg::SSPMSolver::trunc_tmp(SSPMSolver *this,int pindex)

{
  ulong *puVar1;
  int *piVar2;
  uint64_t *puVar3;
  byte bVar4;
  ulong uVar5;
  
  piVar2 = this->tmp_d;
  if (*piVar2 != -1) {
    uVar5 = (ulong)(uint)this->l;
    puVar3 = (this->tmp_b)._bits;
    while ((uVar5 = uVar5 - 1, 0 < (int)uVar5 + 1 && (pindex < piVar2[uVar5]))) {
      bVar4 = (byte)uVar5 & 0x3f;
      puVar1 = puVar3 + (uVar5 >> 6);
      *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
      piVar2[uVar5] = pindex + 1;
    }
  }
  return;
}

Assistant:

void
SSPMSolver::trunc_tmp(int pindex)
{
    if (tmp_d[0] == -1) return; // already Top
    // compute the lowest pindex >= p
    // [pindex],.,...,.. => [pindex],000
    // if pindex is the bottom, then this simply "buries" the remainder
    for (int i=l-1; i>=0 and tmp_d[i] > pindex; i--) {
        tmp_b[i] = 0;
        tmp_d[i] = pindex+1;
    }
}